

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O0

void Abc_TtMoveVar(word *pF,int nVars,int *V2P,int *P2V,int v,int p)

{
  int iVar_00;
  int jVar;
  int iVar;
  int p_local;
  int v_local;
  int *P2V_local;
  int *V2P_local;
  int nVars_local;
  word *pF_local;
  
  iVar_00 = V2P[v];
  if (iVar_00 != p) {
    Abc_TtSwapVars(pF,nVars,iVar_00,p);
    V2P[P2V[iVar_00]] = p;
    V2P[P2V[p]] = iVar_00;
    P2V[iVar_00] = P2V[p] ^ P2V[iVar_00];
    P2V[p] = P2V[iVar_00] ^ P2V[p];
    P2V[iVar_00] = P2V[p] ^ P2V[iVar_00];
  }
  return;
}

Assistant:

static inline void Abc_TtMoveVar( word * pF, int nVars, int * V2P, int * P2V, int v, int p )
{
    int iVar = V2P[v], jVar = p;
    if ( iVar == jVar )
        return;
    Abc_TtSwapVars( pF, nVars, iVar, jVar );
    V2P[P2V[iVar]] = jVar;
    V2P[P2V[jVar]] = iVar;
    P2V[iVar] ^= P2V[jVar];
    P2V[jVar] ^= P2V[iVar];
    P2V[iVar] ^= P2V[jVar];
}